

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O3

void __thiscall Automaton::visitReadNode(Automaton *this,ReadNode node)

{
  QStack<std::_Rb_tree_const_iterator<Node<Read>_>_> *this_00;
  qsizetype *pqVar1;
  ReadNode node_00;
  _Base_ptr p_Var2;
  int iVar3;
  _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
  *this_01;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *psVar4;
  iterator iVar5;
  int iVar6;
  _Base_ptr p_Var7;
  long in_FS_OFFSET;
  _Rb_tree_const_iterator<Node<Read>_> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_node = node._M_node;
  if (*(int *)&node._M_node[1].field_0x4 == 0) {
    iVar6 = this->_M_reads_dfn + 1;
    this->_M_reads_dfn = iVar6;
    *(int *)&node._M_node[1].field_0x4 = iVar6;
    this_00 = &this->_M_reads_stack;
    QtPrivate::QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Read>>>::
    emplace<std::_Rb_tree_const_iterator<Node<Read>>const&>
              ((QMovableArrayOps<std::_Rb_tree_const_iterator<Node<Read>>> *)this_00,
               (this->_M_reads_stack).super_QList<std::_Rb_tree_const_iterator<Node<Read>_>_>.d.size
               ,&local_40);
    QList<std::_Rb_tree_const_iterator<Node<Read>_>_>::end
              (&this_00->super_QList<std::_Rb_tree_const_iterator<Node<Read>_>_>);
    for (p_Var7 = local_40._M_node[1]._M_right; p_Var7 != (_Base_ptr)&local_40._M_node[1]._M_right;
        p_Var7 = *(_Base_ptr *)p_Var7) {
      node_00._M_node = p_Var7->_M_left;
      visitReadNode(this,node_00);
      iVar3 = *(int *)&node_00._M_node[1].field_0x4;
      if (iVar6 < *(int *)&node_00._M_node[1].field_0x4) {
        iVar3 = iVar6;
      }
      *(int *)&local_40._M_node[1].field_0x4 = iVar3;
      this_01 = (_Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
                 *)QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                   ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                                 *)&local_40._M_node[1]._M_parent[2]._M_parent,
                                (_List_iterator<QString> *)&local_40._M_node[1]._M_left);
      psVar4 = QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
               ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                             *)&node_00._M_node[1]._M_parent[2]._M_parent,
                            (_List_iterator<QString> *)&node_00._M_node[1]._M_left);
      std::
      _Rb_tree<std::_List_iterator<QString>,std::_List_iterator<QString>,std::_Identity<std::_List_iterator<QString>>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::_List_iterator<QString>>>
                (this_01,(psVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<std::_List_iterator<QString>_>)
                 &(psVar4->_M_t)._M_impl.super__Rb_tree_header);
    }
    if (*(int *)&local_40._M_node[1].field_0x4 == iVar6) {
      QList<std::_Rb_tree_const_iterator<Node<Read>_>_>::end
                (&this_00->super_QList<std::_Rb_tree_const_iterator<Node<Read>_>_>);
      do {
        iVar5 = QList<std::_Rb_tree_const_iterator<Node<Read>_>_>::end
                          (&this_00->super_QList<std::_Rb_tree_const_iterator<Node<Read>_>_>);
        p_Var2 = iVar5.i[-1]._M_node;
        QList<std::_Rb_tree_const_iterator<Node<Read>_>_>::end
                  (&this_00->super_QList<std::_Rb_tree_const_iterator<Node<Read>_>_>);
        pqVar1 = &(this->_M_reads_stack).super_QList<std::_Rb_tree_const_iterator<Node<Read>_>_>.d.
                  size;
        *pqVar1 = *pqVar1 + -1;
        *(undefined4 *)&p_Var2[1].field_0x4 = 0x7fffffff;
      } while (local_40._M_node != p_Var2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::visitReadNode (ReadNode node)
{
  if (node->dfn != 0)
    return; // nothing to do

  int N = node->dfn = ++_M_reads_dfn;
  _M_reads_stack.push (node);

#ifndef QLALR_NO_DEBUG_INCLUDES
  // qerr() << "*** Debug. visit node (" << id (node->data.state) << ", " << node->data.nt << ")  N = " << N << Qt::endl;
#endif

  for (ReadsGraph::edge_iterator edge = node->begin (); edge != node->end (); ++edge)
    {
      ReadsGraph::iterator r = *edge;

      visitReadNode (r);

      node->dfn = qMin (N, r->dfn);

      NameSet &dst = node->data.state->reads [node->data.nt];
      NameSet &src = r->data.state->reads [r->data.nt];
      dst.insert (src.begin (), src.end ());
    }

  if (node->dfn == N)
    {
      ReadsGraph::iterator tos = _M_reads_stack.top ();

      do {
        tos = _M_reads_stack.top ();
        _M_reads_stack.pop ();
        tos->dfn = INT_MAX;
      } while (tos != node);
    }
}